

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O2

IDWNode * __thiscall gmath::IDWNode::add(IDWNode *this,uint _x,uint _y,float _f,float _w)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  IDWNode *pIVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
LAB_0011d6c2:
  uVar3 = this->x;
  uVar5 = this->s;
  if ((_x < uVar5 + uVar3 && uVar3 <= _x) && (uVar6 = this->y, uVar6 <= _y && _y < uVar6 + uVar5)) {
    if (uVar5 < 2) {
      this->f = _f;
      this->w = _w;
    }
    else {
      uVar9 = (ulong)((uint)(uVar6 + (uVar5 >> 1) <= _y) * 2);
      uVar11 = uVar9 + 1;
      if (_x < uVar3 + (uVar5 >> 1)) {
        uVar11 = uVar9;
      }
      if (this->child[uVar11] == (IDWNode *)0x0) {
        pIVar8 = (IDWNode *)operator_new(0x48);
        IDWNode(pIVar8,_x,_y,_f,_w);
      }
      else {
        pIVar8 = add(this->child[uVar11],_x,_y,_f,_w);
      }
      this->child[uVar11] = pIVar8;
      this->n = 0;
      this->f = 0.0;
      this->w = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
      iVar7 = 0;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        pIVar8 = this->child[lVar10];
        if (pIVar8 != (IDWNode *)0x0) {
          iVar4 = pIVar8->n;
          iVar7 = iVar7 + iVar4;
          this->n = iVar7;
          fVar15 = (float)iVar4;
          uVar1 = pIVar8->f;
          uVar2 = pIVar8->w;
          fVar13 = fVar13 + fVar15 * (float)uVar1;
          fVar14 = fVar14 + fVar15 * (float)uVar2;
          this->f = fVar13;
          this->w = fVar14;
        }
      }
      this->f = fVar13 * (1.0 / (float)iVar7);
      this->w = fVar14 * (1.0 / (float)iVar7);
    }
    return this;
  }
  bVar12 = 0;
  for (; uVar5 != 0; uVar5 = uVar5 >> 1) {
    bVar12 = bVar12 + 1;
  }
  do {
    uVar5 = uVar3 >> (bVar12 & 0x1f);
    if ((uVar5 << (bVar12 & 0x1f) <= _x) && (_x < uVar5 + 1 << (bVar12 & 0x1f))) {
      uVar5 = this->y;
      uVar6 = uVar5 >> (bVar12 & 0x1f);
      if ((uVar6 << (bVar12 & 0x1f) <= _y) && (_y < uVar6 + 1 << (bVar12 & 0x1f))) break;
    }
    bVar12 = bVar12 + 1;
  } while( true );
  pIVar8 = (IDWNode *)operator_new(0x48);
  uVar6 = -1 << (bVar12 & 0x1f);
  IDWNode(pIVar8,uVar3 & uVar6,uVar5 & uVar6,1 << (bVar12 & 0x1f),this);
  this = pIVar8;
  goto LAB_0011d6c2;
}

Assistant:

IDWNode *IDWNode::add(unsigned int _x, unsigned int _y, float _f, float _w)
{
  IDWNode *ret=this;

  // is value covered by this node?

  if (_x >= x && _x < x+s && _y >= y && _y < y+s)
  {
    if (s > 1)
    {
      // check into which child node the data point falls

      int i;
      if (_x < x+(s>>1))
      {
        i=2;
        if (_y < y+(s>>1))
        {
          i=0;
        }
      }
      else
      {
        i=3;
        if (_y < y+(s>>1))
        {
          i=1;
        }
      }

      // add to child node

      if (child[i] != 0)
      {
        child[i]=child[i]->add(_x, _y, _f, _w);
      }
      else
      {
        child[i]=new IDWNode(_x, _y, _f, _w);
      }

      // recalculate data of this node

      n=0;
      f=0;
      w=0;

      for (i=0; i<4; i++)
      {
        if (child[i] != 0)
        {
          const int cn=child[i]->n;

          n+=cn;
          f+=cn*child[i]->f;
          w+=cn*child[i]->w;
        }
      }

      const float scale=1.0f/n;

      f*=scale;
      w*=scale;
    }
    else
    {
      // replace data of node with given data

      f=_f;
      w=_w;
    }
  }
  else
  {
    // compute size of parent node that covers existing and new data

    int i=-1;
    unsigned int k=s;
    while (k > 0)
    {
      k>>=1;
      i++;
    }

    i++;
    while (_x < (x>>i)<<i || _x >= ((x>>i)+1)<<i || _y < (y>>i)<<i || _y >= ((y>>i)+1)<<i)
      i++;

    // create parent node

    ret=new IDWNode((x>>i)<<i, (y>>i)<<i, 1<<i, this);

    // add new data value

    ret=ret->add(_x, _y, _f, _w);
  }

  return ret;
}